

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddl.cpp
# Opt level: O3

void __thiscall ddl::createType(ddl *this,string *typeName,int numFields,string *fields)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  int iVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *__n;
  uint uVar6;
  SystemCatalog *this_00;
  long lVar7;
  type type;
  string local_100;
  string local_e0;
  type local_c0;
  file local_68;
  
  iVar4 = SystemCatalog::getType(this->systemCatalog,typeName);
  __n = &(this->systemCatalog->types)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar4._M_node == __n) {
    ::type::type(&local_c0,typeName,(uint8_t)numFields);
    if (0 < numFields) {
      lVar7 = 0;
      do {
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)&((local_c0.fieldsName.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7))
        ;
        lVar7 = lVar7 + 0x20;
      } while ((ulong)(uint)numFields << 5 != lVar7);
    }
    this_00 = this->systemCatalog;
    p_Var5 = (this_00->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this_00->types)._M_t._M_impl.super__Rb_tree_header;
    uVar6 = 4;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      do {
        iVar3 = calcTypeSize((uint)(byte)(char)p_Var5[2]._M_color);
        uVar6 = uVar6 + iVar3;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
      this_00 = this->systemCatalog;
    }
    this_00->numTypes = this_00->numTypes + 1;
    SystemCatalog::writeNumTypes(this_00);
    pcVar2 = (typeName->_M_dataplus)._M_p;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar2,pcVar2 + typeName->_M_string_length);
    local_c0.dir = createIndex(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    ::type::write(&local_c0,(int)this->systemCatalog + 0x38,(void *)(ulong)uVar6,(size_t)__n);
    std::_Rb_tree<type,type,std::_Identity<type>,std::less<type>,std::allocator<type>>::
    _M_insert_unique<type_const&>
              ((_Rb_tree<type,type,std::_Identity<type>,std::less<type>,std::allocator<type>> *)
               &this->systemCatalog->types,&local_c0);
    pcVar2 = (typeName->_M_dataplus)._M_p;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,pcVar2,pcVar2 + typeName->_M_string_length);
    createAndLinkFiles(&local_68,&local_100,1,0,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.typeName._M_dataplus._M_p != &local_68.typeName.field_2) {
      operator_delete(local_68.typeName._M_dataplus._M_p,
                      local_68.typeName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0.fieldsName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.typeName._M_dataplus._M_p != &local_c0.typeName.field_2) {
      operator_delete(local_c0.typeName._M_dataplus._M_p,
                      local_c0.typeName.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ddl::createType(std::string typeName, int numFields, std::string *fields) {
    auto i = systemCatalog->getType(typeName);

    if(i != systemCatalog->types.end()) {
        return;
    }

    type type(typeName, (int8_t ) numFields);

    for (int j = 0; j < numFields; ++j) {
        type.fieldsName[j] = fields[j];
    }

    int pos = NUM_TYPES;

    //Get the end of file;
    for(auto & _i : systemCatalog->types) {
        pos += calcTypeSize(_i.numFields);

    }

    systemCatalog->numTypes++;

    systemCatalog->writeNumTypes();

    type.dir = createIndex(typeName);

    type.write(systemCatalog->catalogFile, pos);

    systemCatalog->types.insert(type);

    createAndLinkFiles(typeName, 1, 0, 0);
}